

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::SysStatsConfig::SysStatsConfig(SysStatsConfig *this,SysStatsConfig *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pMVar3;
  pointer pVVar4;
  pointer pSVar5;
  undefined8 uVar6;
  uint32_t uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__SysStatsConfig_003a1818;
  this->meminfo_period_ms_ = param_2->meminfo_period_ms_;
  pMVar3 = (param_2->meminfo_counters_).
           super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->meminfo_counters_).
  super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_2->meminfo_counters_).
       super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->meminfo_counters_).
  super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar3;
  (this->meminfo_counters_).
  super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->meminfo_counters_).
       super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->meminfo_counters_).
  super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_2->meminfo_counters_).
  super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->meminfo_counters_).
  super__Vector_base<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->vmstat_period_ms_ = param_2->vmstat_period_ms_;
  pVVar4 = (param_2->vmstat_counters_).
           super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->vmstat_counters_).
  super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_2->vmstat_counters_).
       super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->vmstat_counters_).
  super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ._M_impl.super__Vector_impl_data._M_finish = pVVar4;
  (this->vmstat_counters_).
  super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->vmstat_counters_).
       super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->vmstat_counters_).
  super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_2->vmstat_counters_).
  super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->vmstat_counters_).
  super__Vector_base<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->stat_period_ms_ = param_2->stat_period_ms_;
  pSVar5 = (param_2->stat_counters_).
           super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->stat_counters_).
  super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_2->stat_counters_).
       super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->stat_counters_).
  super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar5;
  (this->stat_counters_).
  super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->stat_counters_).
       super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->stat_counters_).
  super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_2->stat_counters_).
  super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->stat_counters_).
  super__Vector_base<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar7 = param_2->cpufreq_period_ms_;
  this->devfreq_period_ms_ = param_2->devfreq_period_ms_;
  this->cpufreq_period_ms_ = uVar7;
  paVar1 = &(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_2->unknown_fields_)._M_dataplus._M_p;
  paVar8 = &(param_2->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar8) {
    uVar6 = *(undefined8 *)((long)&(param_2->unknown_fields_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->unknown_fields_).field_2 + 8) = uVar6;
  }
  else {
    (this->unknown_fields_)._M_dataplus._M_p = pcVar2;
    (this->unknown_fields_).field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  (this->unknown_fields_)._M_string_length = (param_2->unknown_fields_)._M_string_length;
  (param_2->unknown_fields_)._M_dataplus._M_p = (pointer)paVar8;
  (param_2->unknown_fields_)._M_string_length = 0;
  (param_2->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_2->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

SysStatsConfig::SysStatsConfig(SysStatsConfig&&) noexcept = default;